

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O1

Class class_setSuperclass(Class cls,Class newSuper)

{
  Class poVar1;
  Class poVar2;
  Class *ppoVar3;
  Class poVar4;
  Class poVar5;
  byte bVar6;
  mutex_t *lock;
  Class poVar7;
  
  if (newSuper == (Class)0x0 || cls == (Class)0x0) {
    poVar7 = (Class)0x0;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&runtime_mutex);
    poVar1 = cls->super_class;
    if (poVar1 == newSuper) {
      bVar6 = 0;
      poVar7 = newSuper;
    }
    else {
      if ((cls->info & 0x200) != 0) {
        poVar7 = poVar1->subclass_list;
        if (poVar1->subclass_list == cls) {
          ppoVar3 = &poVar1->subclass_list;
        }
        else {
          do {
            poVar4 = poVar7;
            if (poVar4 == (Class)0x0) goto LAB_001153b8;
            poVar7 = poVar4->sibling_class;
          } while (poVar4->sibling_class != cls);
          ppoVar3 = &poVar4->sibling_class;
        }
        *ppoVar3 = cls->sibling_class;
      }
LAB_001153b8:
      objc_resolve_class(newSuper);
      cls->super_class = newSuper;
      cls->sibling_class = newSuper->subclass_list;
      newSuper->subclass_list = cls;
      if ((cls->info & 1) == 0) {
        poVar7 = cls->isa;
        poVar4 = newSuper->isa;
        if ((poVar7->info & 0x200) != 0) {
          poVar2 = poVar7->super_class->subclass_list;
          if (poVar2 == poVar7) {
            ppoVar3 = &poVar7->super_class->subclass_list;
          }
          else {
            do {
              poVar5 = poVar2;
              if (poVar5 == (Class)0x0) goto LAB_00115417;
              poVar2 = poVar5->sibling_class;
            } while (poVar5->sibling_class != poVar7);
            ppoVar3 = &poVar5->sibling_class;
          }
          *ppoVar3 = poVar7->sibling_class;
        }
LAB_00115417:
        objc_resolve_class(poVar4);
        poVar7->super_class = poVar4;
        poVar7->isa = poVar4->isa;
        poVar7->sibling_class = poVar4->subclass_list;
        poVar4->subclass_list = poVar7;
      }
      else {
        cls->isa = newSuper->isa;
      }
      pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
      bVar6 = (byte)((uint)(int)cls->info >> 8) & 1;
      pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
      poVar7 = poVar1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
    if (bVar6 != 0) {
      objc_send_initialize((id)newSuper);
      objc_update_dtable_for_new_superclass(cls->isa,newSuper->isa);
      objc_update_dtable_for_new_superclass(cls,newSuper);
      poVar7 = poVar1;
    }
  }
  return poVar7;
}

Assistant:

__attribute__((deprecated))
Class class_setSuperclass(Class cls, Class newSuper)
{
	CHECK_ARG(cls);
	CHECK_ARG(newSuper);
	Class oldSuper;
	if (Nil == cls) { return Nil; }

	{
		LOCK_RUNTIME_FOR_SCOPE();

		oldSuper = cls->super_class;

		if (oldSuper == newSuper) { return newSuper; }

		safe_remove_from_subclass_list(cls);
		objc_resolve_class(newSuper);

		cls->super_class = newSuper;

		// The super class's subclass list is used in certain method resolution scenarios.
		cls->sibling_class = cls->super_class->subclass_list;
		cls->super_class->subclass_list = cls;

		if (UNLIKELY(class_isMetaClass(cls)))
		{
			// newSuper is presumably a metaclass. Its isa will therefore be the appropriate root metaclass.
			cls->isa = newSuper->isa;
		}
		else
		{
			Class meta = cls->isa, newSuperMeta = newSuper->isa;
			// Update the metaclass's superclass.
			safe_remove_from_subclass_list(meta);
			objc_resolve_class(newSuperMeta);

			meta->super_class = newSuperMeta;
			meta->isa = newSuperMeta->isa;

			// The super class's subclass list is used in certain method resolution scenarios.
			meta->sibling_class = newSuperMeta->subclass_list;
			newSuperMeta->subclass_list = meta;
		}

		LOCK_FOR_SCOPE(&initialize_lock);
		if (!objc_test_class_flag(cls, objc_class_flag_initialized))
		{
			// Uninitialized classes don't have dtables to update
			// and don't need their superclasses initialized.
			return oldSuper;
		}
	}

	objc_send_initialize((id)newSuper); // also initializes the metaclass
	objc_update_dtable_for_new_superclass(cls->isa, newSuper->isa);
	objc_update_dtable_for_new_superclass(cls, newSuper);

	return oldSuper;
}